

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_txfm1d_sse4.h
# Opt level: O0

void transpose_32(int txfm_size,__m128i *input,__m128i *output)

{
  int stride;
  long in_RDX;
  long in_RSI;
  int in_EDI;
  int c;
  int r;
  int col_size;
  int row_size;
  int num_per_128;
  undefined4 local_2c;
  undefined4 local_28;
  
  stride = in_EDI / 4;
  for (local_28 = 0; local_28 < in_EDI; local_28 = local_28 + 4) {
    for (local_2c = 0; local_2c < stride; local_2c = local_2c + 1) {
      transpose_32_4x4(stride,(__m128i *)(in_RSI + (long)(local_28 * stride + local_2c) * 0x10),
                       (__m128i *)(in_RDX + (long)(local_2c * 4 * stride + local_28 / 4) * 0x10));
    }
  }
  return;
}

Assistant:

static inline void transpose_32(int txfm_size, const __m128i *input,
                                __m128i *output) {
  const int num_per_128 = 4;
  const int row_size = txfm_size;
  const int col_size = txfm_size / num_per_128;
  int r, c;

  // transpose each 4x4 block internally
  for (r = 0; r < row_size; r += 4) {
    for (c = 0; c < col_size; c++) {
      transpose_32_4x4(col_size, &input[r * col_size + c],
                       &output[c * 4 * col_size + r / 4]);
    }
  }
}